

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c-wrapper.h
# Opt level: O0

string * __thiscall
wasm::wasm2cMangle_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Name name,Signature sig)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  uintptr_t *puVar5;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar6;
  Type *param;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  anon_class_1_0_00000001 local_211;
  string local_210 [7];
  anon_class_1_0_00000001 wasm2cSignature;
  stringstream local_1f0 [8];
  stringstream ss;
  undefined1 local_1e0 [383];
  byte local_61;
  const_iterator pvStack_60;
  uchar c;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  allocator<char> local_33;
  undefined1 local_32;
  undefined1 local_31;
  Type TStack_30;
  char escapePrefix;
  Signature sig_local;
  Name name_local;
  string *mangled;
  
  sig_local.params = sig.params.id;
  TStack_30.id = name.super_IString.str._M_str;
  local_31 = 0x5a;
  local_32 = 0;
  sig_local.results.id = (uintptr_t)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Z_",&local_33);
  std::allocator<char>::~allocator(&local_33);
  __begin1 = (const_iterator)&sig_local.results;
  __end1 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)__begin1);
  pvStack_60 = std::basic_string_view<char,_std::char_traits<char>_>::end
                         ((basic_string_view<char,_std::char_traits<char>_> *)__begin1);
  for (; __end1 != pvStack_60; __end1 = __end1 + 1) {
    local_61 = *__end1;
    iVar3 = isalnum((uint)local_61);
    if (((iVar3 == 0) || (local_61 == 0x5a)) && (local_61 != 0x5f)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'Z');
      std::__cxx11::stringstream::stringstream(local_1f0);
      pvVar4 = (void *)std::ostream::operator<<(local_1e0,std::hex);
      pvVar4 = (void *)std::ostream::operator<<(pvVar4,std::uppercase);
      std::ostream::operator<<(pvVar4,(uint)local_61);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_210);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::stringstream::~stringstream(local_1f0);
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_61);
    }
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Z_");
  cVar1 = wasm2cMangle::anon_class_1_0_00000001::operator()(&local_211,sig_local.params);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
  bVar2 = Type::isTuple(&stack0xffffffffffffffd0);
  if (bVar2) {
    join_0x00000010_0x00000000_ =
         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
         Type::begin(&stack0xffffffffffffffd0);
    PVar6 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            Type::end(&stack0xffffffffffffffd0);
    while( true ) {
      __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar6.index;
      param = PVar6.parent;
      bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                         &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                 &param);
      if (!bVar2) break;
      puVar5 = (uintptr_t *)
               ::wasm::Type::Iterator::operator*
                         ((Iterator *)
                          &__end2.
                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                         );
      cVar1 = wasm2cMangle::anon_class_1_0_00000001::operator()(&local_211,(Type)*puVar5);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                 &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
      PVar6.index = (size_t)__end2.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar6.parent = param;
    }
  }
  else {
    cVar1 = wasm2cMangle::anon_class_1_0_00000001::operator()(&local_211,TStack_30);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string wasm2cMangle(Name name, Signature sig) {
  const char escapePrefix = 'Z';
  std::string mangled = "Z_";
  for (unsigned char c : name.str) {
    if ((isalnum(c) && c != escapePrefix) || c == '_') {
      // This character is ok to emit as it is.
      mangled += c;
    } else {
      // This must be escaped, as prefix + hex character code.
      mangled += escapePrefix;
      std::stringstream ss;
      ss << std::hex << std::uppercase << unsigned(c);
      mangled += ss.str();
    }
  }

  // Emit the result and params.
  mangled += "Z_";

  auto wasm2cSignature = [](Type type) {
    TODO_SINGLE_COMPOUND(type);
    switch (type.getBasic()) {
      case Type::none:
        return 'v';
      case Type::i32:
        return 'i';
      case Type::i64:
        return 'j';
      case Type::f32:
        return 'f';
      case Type::f64:
        return 'd';
      default:
        Fatal() << "unhandled wasm2c wrapper signature type: " << type;
    }
  };

  mangled += wasm2cSignature(sig.results);
  if (sig.params.isTuple()) {
    for (const auto& param : sig.params) {
      mangled += wasm2cSignature(param);
    }
  } else {
    mangled += wasm2cSignature(sig.params);
  }

  return mangled;
}